

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_divl_EAX_x86_64(CPUX86State *env,target_ulong t0)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uintptr_t unaff_retaddr;
  
  uVar3 = t0 & 0xffffffff;
  if (uVar3 != 0) {
    uVar1 = env->regs[2] << 0x20 | (ulong)(uint)env->regs[0];
    uVar2 = uVar1 / uVar3;
    if (uVar2 >> 0x20 == 0) {
      env->regs[0] = uVar2;
      env->regs[2] = uVar1 % uVar3;
      return;
    }
  }
  raise_exception_ra_x86_64(env,0,unaff_retaddr);
}

Assistant:

void helper_divl_EAX(CPUX86State *env, target_ulong t0)
{
    unsigned int den, r;
    uint64_t num, q;

    num = ((uint32_t)env->regs[R_EAX]) | ((uint64_t)((uint32_t)env->regs[R_EDX]) << 32);
    den = (unsigned int)t0;
    if (den == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q = (num / den);
    r = (num % den);
    if (q > 0xffffffff) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    env->regs[R_EAX] = (uint32_t)q;
    env->regs[R_EDX] = (uint32_t)r;
}